

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkPipelineShaderStageCreateInfo *pStages,uint32_t stageCount,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  uint uVar1;
  VkSpecializationMapEntry *pVVar2;
  VkPipelineShaderStageCreateInfo *pVVar3;
  bool bVar4;
  VkSpecializationInfo *pVVar5;
  DynamicStateInfo *pDVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  Data local_158;
  Data local_148;
  DynamicStateInfo *local_138;
  VkPipelineShaderStageCreateInfo *local_130;
  Value stage;
  Value stages;
  Value map_entries;
  Value spec;
  Value map_entry;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  GenericStringRef<char> local_70;
  StringRefType local_60;
  string local_50;
  
  stages.data_.n = (Number)0x0;
  stages.data_.s.str = (Ch *)0x4000000000000;
  bVar10 = stageCount == 0;
  if (!bVar10) {
    uVar9 = 0;
    local_138 = (DynamicStateInfo *)alloc;
    do {
      local_130 = pStages + uVar9;
      stage.data_.n = (Number)0x0;
      stage.data_.s.str = (Ch *)0x3000000000000;
      local_158._4_1_ = '\0';
      local_158._5_1_ = '\0';
      local_158._6_1_ = '\0';
      local_158._7_1_ = '\0';
      local_158._0_4_ = pStages[uVar9].flags;
      local_148.s.str = (Ch *)0x4050000003e9172;
      local_148.n = (Number)0x5;
      local_158.s.str = (Ch *)((ulong)(-1 < (int)pStages[uVar9].flags) << 0x35 | 0x1d6000000000000);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&stage,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_148.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_158.s,alloc);
      local_60.s = "name";
      local_60.length = 4;
      local_70.s = pStages[uVar9].pName;
      local_70.length = rapidjson::GenericStringRef<char>::NotNullStrLen(&local_70,local_70.s);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&stage,&local_60,&local_70,
                  (MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_138);
      uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((Fossilize *)&local_148.s,(uint64_t)pStages[uVar9].module,
                 (MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_138);
      alloc = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_138;
      local_158.s.str = (Ch *)0x4050000003b4243;
      local_158.n = (Number)0x6;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&stage,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_158.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_148.s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_138);
      local_80.s = "stage";
      local_80.length = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkShaderStageFlagBits>(&stage,&local_80,pStages[uVar9].stage,alloc);
      pDVar6 = (DynamicStateInfo *)0xffff000000000000;
      if (pStages[uVar9].pSpecializationInfo != (VkSpecializationInfo *)0x0) {
        spec.data_.n = (Number)0x0;
        spec.data_.s.str = (Ch *)0x3000000000000;
        local_90.s = "dataSize";
        local_90.length = 8;
        pDVar6 = (DynamicStateInfo *)alloc;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_long>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&spec,&local_90,(pStages[uVar9].pSpecializationInfo)->dataSize,alloc);
        pVVar3 = local_130;
        local_a0.s = "data";
        local_a0.length = 4;
        encode_base64_abi_cxx11_
                  (&local_50,(Fossilize *)local_130->pSpecializationInfo->pData,
                   (void *)local_130->pSpecializationInfo->dataSize,(size_t)pDVar6);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
        ::AddMember<std::__cxx11::string>
                  ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    *)&spec,&local_a0,&local_50,alloc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        alloc = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_138;
        map_entries.data_.n = (Number)0x0;
        map_entries.data_.s.str = (Ch *)0x4000000000000;
        pVVar5 = pVVar3->pSpecializationInfo;
        if (pVVar5->mapEntryCount != 0) {
          lVar7 = 8;
          uVar8 = 0;
          do {
            pVVar2 = pVVar5->pMapEntries;
            map_entry.data_.n = (Number)0x0;
            map_entry.data_.s.str = (Ch *)0x3000000000000;
            uVar1 = *(uint *)((long)pVVar2 + lVar7 + -4);
            local_158._4_1_ = '\0';
            local_158._5_1_ = '\0';
            local_158._6_1_ = '\0';
            local_158._7_1_ = '\0';
            local_158._0_4_ = uVar1;
            local_148.s.str = (Ch *)0x4050000003e3a6a;
            local_148.n = (Number)0x6;
            local_158.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&map_entry,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_148.s,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_158.s,alloc);
            local_b0.s = "size";
            local_b0.length = 4;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<unsigned_long>
                      (&map_entry,&local_b0,*(unsigned_long *)((long)&pVVar2->constantID + lVar7),
                       alloc);
            uVar1 = *(uint *)((long)pVVar2 + lVar7 + -8);
            local_158._4_1_ = '\0';
            local_158._5_1_ = '\0';
            local_158._6_1_ = '\0';
            local_158._7_1_ = '\0';
            local_158._0_4_ = uVar1;
            local_148.s.str = (Ch *)0x4050000003b41f2;
            local_148.n.i64 = (Number)0xa;
            local_158.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&map_entry,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_148.s,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_158.s,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&map_entries,&map_entry,alloc);
            uVar8 = uVar8 + 1;
            pVVar5 = local_130->pSpecializationInfo;
            lVar7 = lVar7 + 0x10;
          } while (uVar8 < pVVar5->mapEntryCount);
        }
        local_158.s.str = (Ch *)0x4050000003b4206;
        local_158.n = (Number)0xa;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&spec,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&local_158.s,&map_entries,alloc);
        local_158.s.str = (Ch *)0x4050000003b424a;
        local_158.n.i64 = (Number)0x12;
        pDVar6 = (DynamicStateInfo *)alloc;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&stage,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)&local_158.s,&spec,alloc);
      }
      bVar4 = pnext_chain_add_json_value<VkPipelineShaderStageCreateInfo,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (&stage,local_130,alloc,pDVar6);
      if (!bVar4) {
        return bVar10;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack(&stages,&stage,alloc);
      uVar9 = uVar9 + 1;
      bVar10 = stageCount <= uVar9;
    } while (uVar9 != stageCount);
  }
  if (&stages != out_value) {
    (out_value->data_).n = stages.data_.n;
    (out_value->data_).s.str = stages.data_.s.str;
  }
  return bVar10;
}

Assistant:

static bool json_value(const VkPipelineShaderStageCreateInfo *pStages, uint32_t stageCount,
                       Allocator &alloc, Value *out_value)
{
	Value stages(kArrayType);
	for (uint32_t i = 0; i < stageCount; i++)
	{
		auto &s = pStages[i];
		Value stage(kObjectType);
		stage.AddMember("flags", s.flags, alloc);
		stage.AddMember("name", StringRef(s.pName), alloc);
		stage.AddMember("module", uint64_string(api_object_cast<uint64_t>(s.module), alloc), alloc);
		stage.AddMember("stage", s.stage, alloc);
		if (s.pSpecializationInfo)
		{
			Value spec(kObjectType);
			spec.AddMember("dataSize", uint64_t(s.pSpecializationInfo->dataSize), alloc);
			spec.AddMember("data",
			               encode_base64(s.pSpecializationInfo->pData,
			                             s.pSpecializationInfo->dataSize), alloc);
			Value map_entries(kArrayType);
			for (uint32_t j = 0; j < s.pSpecializationInfo->mapEntryCount; j++)
			{
				auto &e = s.pSpecializationInfo->pMapEntries[j];
				Value map_entry(kObjectType);
				map_entry.AddMember("offset", e.offset, alloc);
				map_entry.AddMember("size", uint64_t(e.size), alloc);
				map_entry.AddMember("constantID", e.constantID, alloc);
				map_entries.PushBack(map_entry, alloc);
			}
			spec.AddMember("mapEntries", map_entries, alloc);
			stage.AddMember("specializationInfo", spec, alloc);
		}

		if (!pnext_chain_add_json_value(stage, s, alloc, nullptr))
			return false;
		stages.PushBack(stage, alloc);
	}

	*out_value = stages;
	return true;
}